

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O3

int Test_SUNMatCopy(SUNMatrix A,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix B;
  
  B = SUNMatClone(A);
  uVar1 = SUNMatCopy(A,B);
  if (uVar1 == 0) {
    iVar2 = check_matrix(B,A,2.220446049250313e-15);
    if (iVar2 == 0) {
      iVar2 = 0;
      if (myid != 0) goto LAB_00104083;
      puts("    PASSED test -- SUNMatCopy ");
    }
    else {
      printf(">>> FAILED test -- SUNMatCopy check, Proc %d \n",(ulong)(uint)myid);
      iVar2 = 1;
    }
    if (print_time != 0) {
      printf("    SUNMatCopy Time: %22.15e \n \n",0);
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",(ulong)uVar1,(ulong)(uint)myid)
    ;
    iVar2 = 1;
  }
LAB_00104083:
  SUNMatDestroy(B);
  return iVar2;
}

Assistant:

int Test_SUNMatCopy(SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;
  SUNMatrix B;
  realtype  tol=10*UNIT_ROUNDOFF;

  B = SUNMatClone(A);

  /* copy matrix data */
  start_time = get_time();
  failure = SUNMatCopy(A, B);
  stop_time = get_time();

  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",
           failure, myid);
    SUNMatDestroy(B);
    return(1);
  }

  /* check matrix entries */
  failure = check_matrix(B, A, tol);

  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy check, Proc %d \n", myid);
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNMatCopy \n");
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return(0);
}